

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O0

void __thiscall node::BlockAssembler::AddToBlock(BlockAssembler *this,txiter iter)

{
  string_view source_file;
  string_view logging_function;
  int32_t iVar1;
  pointer pCVar2;
  int64_t iVar3;
  CAmount *pCVar4;
  char *pcVar5;
  char *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<transaction_identifier<false>,_true,_true>,_bool> pVar6;
  Level in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe7c;
  CTxMemPoolEntry *in_stack_fffffffffffffe80;
  unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  *in_stack_fffffffffffffe88;
  shared_ptr<const_CTransaction> *in_stack_fffffffffffffe90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe98;
  vector<long,_std::allocator<long>_> *flag;
  int source_line;
  ConstevalFormatString<2U> in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  char *pcVar8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar9;
  undefined1 local_60 [8];
  _Node_iterator_base<transaction_identifier<false>,_true> local_58;
  undefined1 local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar8 = in_RDI;
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator->
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffe80);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::operator->
            ((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  source_line = (int)((ulong)local_60 >> 0x20);
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  CTxMemPoolEntry::GetFee
            ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe88,
             (value_type_conflict3 *)in_stack_fffffffffffffe80);
  pCVar2 = std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::
           operator->((unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                       *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  flag = &pCVar2->vTxSigOpsCost;
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  CTxMemPoolEntry::GetSigOpCost
            ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::vector<long,_std::allocator<long>_>::push_back
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (value_type_conflict3 *)0x4a38b7);
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  iVar1 = CTxMemPoolEntry::GetTxWeight
                    ((CTxMemPoolEntry *)
                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + (long)iVar1;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  iVar3 = CTxMemPoolEntry::GetSigOpCost
                    ((CTxMemPoolEntry *)
                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + iVar3;
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  pCVar4 = CTxMemPoolEntry::GetFee
                     ((CTxMemPoolEntry *)
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + *pCVar4;
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
  ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffe80);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  CTransaction::GetHash
            ((CTransaction *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  pVar6 = std::
          unordered_set<transaction_identifier<false>,_SaltedTxidHasher,_std::equal_to<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
          ::insert(in_stack_fffffffffffffe88,(value_type *)in_stack_fffffffffffffe80);
  local_58._M_cur =
       (__node_type *)
       pVar6.first.super__Node_iterator_base<transaction_identifier<false>,_true>._M_cur;
  local_50 = pVar6.second;
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if ((in_RDI[0xc1] & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
    ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                  *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    pcVar5 = (char *)CTxMemPoolEntry::GetModifiedFee
                               ((CTxMemPoolEntry *)
                                CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
    ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                  *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    CTxMemPoolEntry::GetTxSize
              ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffffe98,(CAmount *)in_stack_fffffffffffffe90,
                       (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    uVar9 = 3;
    CFeeRate::ToString_abi_cxx11_
              ((CFeeRate *)in_stack_fffffffffffffe90,(FeeEstimateMode *)in_stack_fffffffffffffe88);
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
    ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                  *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    CTxMemPoolEntry::GetTx
              ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    transaction_identifier<false>::ToString_abi_cxx11_
              ((transaction_identifier<false> *)in_stack_fffffffffffffe80);
    uVar7 = 2;
    logging_function._M_len._4_4_ = uVar9;
    logging_function._M_len._0_4_ = in_stack_ffffffffffffff40;
    logging_function._M_str = pcVar5;
    source_file._M_str = pcVar8;
    source_file._M_len = in_stack_ffffffffffffff30;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,source_line,(LogFlags)flag,in_stack_00000020,
               in_stack_ffffffffffffff28,in_stack_00000030,in_stack_00000038);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,uVar7));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,uVar7));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockAssembler::AddToBlock(CTxMemPool::txiter iter)
{
    pblocktemplate->block.vtx.emplace_back(iter->GetSharedTx());
    pblocktemplate->vTxFees.push_back(iter->GetFee());
    pblocktemplate->vTxSigOpsCost.push_back(iter->GetSigOpCost());
    nBlockWeight += iter->GetTxWeight();
    ++nBlockTx;
    nBlockSigOpsCost += iter->GetSigOpCost();
    nFees += iter->GetFee();
    inBlock.insert(iter->GetSharedTx()->GetHash());

    if (m_options.print_modified_fee) {
        LogPrintf("fee rate %s txid %s\n",
                  CFeeRate(iter->GetModifiedFee(), iter->GetTxSize()).ToString(),
                  iter->GetTx().GetHash().ToString());
    }
}